

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O0

void leopard::ff16::FWHT(ffe_t *data,uint m,uint m_truncated)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int i_1;
  int i;
  int i_end;
  int r;
  uint dist4;
  uint dist;
  ffe_t t3;
  ffe_t t2;
  ffe_t t1;
  ffe_t t0;
  uint s2;
  ffe_t dif_3;
  ffe_t sum_3;
  ffe_t dif_2;
  ffe_t sum_2;
  ffe_t dif_1;
  ffe_t sum_1;
  ffe_t dif;
  ffe_t sum;
  ffe_t dif_4;
  ffe_t sum_4;
  int local_b8;
  int local_b4;
  int local_ac;
  uint local_a8;
  uint local_a4;
  ffe_t local_90;
  ffe_t local_8e;
  ffe_t local_8c;
  ffe_t local_8a;
  uint local_88;
  uint local_84;
  ffe_t *local_80;
  ffe_t local_74;
  ffe_t local_72;
  ffe_t *local_70;
  ffe_t *local_68;
  ffe_t local_5c;
  ffe_t local_5a;
  ffe_t *local_58;
  ffe_t *local_50;
  ffe_t local_44;
  ffe_t local_42;
  ffe_t *local_40;
  ffe_t *local_38;
  ffe_t local_2c;
  ffe_t local_2a;
  ffe_t *local_28;
  ffe_t *local_20;
  ffe_t local_14;
  ffe_t local_12;
  ffe_t *local_10;
  ffe_t *local_8;
  
  local_a4 = 1;
  for (local_a8 = 4; local_a8 <= in_ESI; local_a8 = local_a8 << 2) {
    for (local_ac = 0; local_ac < in_EDX; local_ac = local_a8 + local_ac) {
      for (local_b4 = local_ac; local_b4 < (int)(local_ac + local_a4); local_b4 = local_b4 + 1) {
        local_80 = (ffe_t *)(in_RDI + (long)local_b4 * 2);
        local_84 = local_a4;
        local_88 = local_a4 * 2;
        local_8a = *local_80;
        local_8c = local_80[local_a4];
        local_8e = local_80[local_88];
        local_90 = local_80[local_a4 * 3];
        local_20 = &local_8a;
        local_28 = &local_8c;
        local_2a = AddMod(local_8a,local_8c);
        local_2c = SubMod(*local_20,*local_28);
        *local_20 = local_2a;
        *local_28 = local_2c;
        local_38 = &local_8e;
        local_40 = &local_90;
        local_42 = AddMod(local_8e,local_90);
        local_44 = SubMod(*local_38,*local_40);
        *local_38 = local_42;
        *local_40 = local_44;
        local_50 = &local_8a;
        local_58 = &local_8e;
        local_5a = AddMod(local_8a,local_8e);
        local_5c = SubMod(*local_50,*local_58);
        *local_50 = local_5a;
        *local_58 = local_5c;
        local_68 = &local_8c;
        local_70 = &local_90;
        local_72 = AddMod(local_8c,local_90);
        local_74 = SubMod(*local_68,*local_70);
        *local_68 = local_72;
        *local_70 = local_74;
        *local_80 = local_8a;
        local_80[local_84] = local_8c;
        local_80[local_88] = local_8e;
        local_80[local_88 + local_84] = local_90;
      }
    }
    local_a4 = local_a8;
  }
  if (local_a4 < in_ESI) {
    for (local_b8 = 0; local_b8 < (int)local_a4; local_b8 = local_b8 + 1) {
      local_8 = (ffe_t *)(in_RDI + (long)local_b8 * 2);
      local_10 = (ffe_t *)(in_RDI + (ulong)(local_b8 + local_a4) * 2);
      local_12 = AddMod(*local_8,*local_10);
      local_14 = SubMod(*local_8,*local_10);
      *local_8 = local_12;
      *local_10 = local_14;
    }
  }
  return;
}

Assistant:

static void FWHT(ffe_t* data, const unsigned m, const unsigned m_truncated)
{
    // Decimation in time: Unroll 2 layers at a time
    unsigned dist = 1, dist4 = 4;
    for (; dist4 <= m; dist = dist4, dist4 <<= 2)
    {
        // For each set of dist*4 elements:
#pragma omp parallel for
        for (int r = 0; r < (int)m_truncated; r += dist4)
        {
            // For each set of dist elements:
            const int i_end = r + dist;
            for (int i = r; i < i_end; ++i)
                FWHT_4(data + i, dist);
        }
    }

    // If there is one layer left:
    if (dist < m)
#pragma omp parallel for
        for (int i = 0; i < (int)dist; ++i)
            FWHT_2(data[i], data[i + dist]);
}